

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MethodBuilder.cpp
# Opt level: O0

size_t __thiscall
Lodtalk::MethodAssembler::Assembler::addLiteralAlways(Assembler *this,Oop newLiteral)

{
  OopRef local_40;
  size_type local_20;
  size_type ret;
  Assembler *this_local;
  Oop newLiteral_local;
  
  ret = (size_type)this;
  this_local = (Assembler *)newLiteral.field_0;
  local_20 = std::vector<Lodtalk::OopRef,_std::allocator<Lodtalk::OopRef>_>::size(&this->literals);
  OopRef::OopRef(&local_40,(Oop *)&this_local);
  std::vector<Lodtalk::OopRef,_std::allocator<Lodtalk::OopRef>_>::push_back
            (&this->literals,&local_40);
  OopRef::~OopRef(&local_40);
  return local_20;
}

Assistant:

size_t Assembler::addLiteralAlways(Oop newLiteral)
{
    auto ret = literals.size();
	literals.push_back(newLiteral);
	return ret;
}